

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlers.cpp
# Opt level: O1

bool Handlers::packet_handler_register::StateCheck(EOClient *client,unsigned_short allow_states)

{
  ushort uVar1;
  bool bVar2;
  
  switch(client->state) {
  case Uninitialized:
    uVar1 = allow_states & 1;
    break;
  case Initialized:
    uVar1 = allow_states & 2;
    break;
  case LoggedIn:
    if (client->player->character == (Character *)0x0) {
      uVar1 = allow_states & 4;
    }
    else {
      uVar1 = allow_states & 8;
    }
    break;
  case Playing:
    uVar1 = allow_states & 0x10;
    break;
  default:
    goto switchD_0018e3a2_default;
  }
  bVar2 = true;
  if (uVar1 == 0) {
switchD_0018e3a2_default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool packet_handler_register::StateCheck(EOClient *client, unsigned short allow_states)
{
	switch (client->state)
	{
		case EOClient::Uninitialized:
			if (allow_states & Uninitialized)
				return true;

			break;

		case EOClient::Initialized:
			if (allow_states & Menu)
				return true;

			break;

		case EOClient::LoggedIn:
			if (client->player->character)
			{
				if (allow_states & Logging_In)
					return true;
			}
			else
			{
				if (allow_states & Character_Menu)
					return true;
			}

			break;

		case EOClient::Playing:
			if (allow_states & Playing)
				return true;

			break;
	};

	return false;
}